

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ParseAnyTypeUrl
          (internal *this,string_view type_url,string *url_prefix,string *full_type_name)

{
  size_type sVar1;
  size_type sVar2;
  allocator<char> local_b1;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string local_a0 [55];
  allocator<char> local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string local_58 [32];
  size_type local_38;
  size_t pos;
  string *full_type_name_local;
  string *url_prefix_local;
  string_view type_url_local;
  
  full_type_name_local = (string *)type_url._M_str;
  type_url_local._M_len = type_url._M_len;
  pos = (size_t)url_prefix;
  url_prefix_local = (string *)this;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)&url_prefix_local,'/',
                        0xffffffffffffffff);
  if ((local_38 != 0xffffffffffffffff) &&
     (sVar1 = local_38 + 1,
     sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&url_prefix_local),
     sVar1 != sVar2)) {
    if (full_type_name_local != (string *)0x0) {
      local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&url_prefix_local,0,
                            local_38 + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_58,&local_68,&local_69);
      std::__cxx11::string::operator=((string *)full_type_name_local,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_69);
    }
    local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&url_prefix_local,
                          local_38 + 1,0xffffffffffffffff);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_a0,&local_b0,&local_b1);
    std::__cxx11::string::operator=((string *)pos,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_b1);
    return true;
  }
  return false;
}

Assistant:

bool ParseAnyTypeUrl(absl::string_view type_url,
                     std::string* PROTOBUF_NULLABLE url_prefix,
                     std::string* PROTOBUF_NONNULL full_type_name) {
  size_t pos = type_url.find_last_of('/');
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = std::string(type_url.substr(0, pos + 1));
  }
  *full_type_name = std::string(type_url.substr(pos + 1));
  return true;
}